

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O0

void __thiscall
slang::SourceSnippet::SourceSnippet(SourceSnippet *this,string_view sourceLine,uint32_t tabStop)

{
  ulong uVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  reference piVar4;
  size_type sVar5;
  char *in_RDX;
  size_t in_RSI;
  SmallVectorBase<int> *in_RDI;
  size_t columnWidth;
  size_t i;
  size_t column;
  SmallVector<char,_40UL> buffer;
  size_t i_1;
  pair<unsigned_long,_unsigned_long> *in_stack_fffffffffffffe78;
  SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_> *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  SmallVectorBase<char> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  SmallVectorBase<int> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e9;
  size_type local_c8;
  size_type local_c0;
  pair<unsigned_long,_unsigned_long> local_b8;
  size_t local_a8;
  char *pcStack_a0;
  long local_90;
  ulong local_88;
  size_t *columnWidth_00;
  SmallVectorBase<char> *in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff94;
  size_t *in_stack_ffffffffffffff98;
  string_view in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_len = in_RSI;
  local_10._M_str = in_RDX;
  SmallVector<int,_10UL>::SmallVector((SmallVector<int,_10UL> *)0x66823b);
  this_00 = in_RDI + 2;
  SmallVector<std::pair<unsigned_long,_unsigned_long>,_4UL>::SmallVector
            ((SmallVector<std::pair<unsigned_long,_unsigned_long>,_4UL> *)0x668251);
  std::__cxx11::string::string(in_stack_fffffffffffffea0);
  std::__cxx11::string::string(in_stack_fffffffffffffea0);
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  SmallVectorBase<int>::resize
            ((SmallVectorBase<int> *)in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78)
  ;
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    __str = local_38;
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             SmallVectorBase<int>::size(in_RDI);
    if (pbVar3 <= __str) break;
    piVar4 = SmallVectorBase<int>::operator[](in_RDI,(size_type)local_38);
    *piVar4 = -1;
    local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&(local_38->_M_dataplus)._M_p + 1);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
  SmallVector<char,_40UL>::SmallVector((SmallVector<char,_40UL> *)0x668374);
  columnWidth_00 = (size_t *)0x0;
  local_88 = 0;
  while( true ) {
    uVar1 = local_88;
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
    iVar6 = (int)columnWidth_00;
    if (sVar5 <= uVar1) break;
    piVar4 = SmallVectorBase<int>::operator[](in_RDI,local_88);
    *piVar4 = iVar6;
    SmallVectorBase<char>::clear((SmallVectorBase<char> *)in_stack_fffffffffffffe80);
    local_a8 = local_10._M_len;
    pcStack_a0 = local_10._M_str;
    bVar2 = printableTextForNextChar
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94
                       ,in_stack_ffffffffffffff88,columnWidth_00);
    if (!bVar2) {
      local_c0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 size((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_RDI[4].firstElement);
      local_c8 = SmallVectorBase<char>::size((SmallVectorBase<char> *)&stack0xffffffffffffff88);
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
                (&local_b8,&local_c0,&local_c8);
      SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::push_back
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    }
    in_stack_fffffffffffffea0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI[4].firstElement
    ;
    in_stack_fffffffffffffe98 = (SmallVectorBase<char> *)&stack0xffffffffffffff88;
    SmallVectorBase<char>::data(in_stack_fffffffffffffe98);
    SmallVectorBase<char>::size(in_stack_fffffffffffffe98);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (in_stack_fffffffffffffe90,
               (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
               (size_type)in_stack_fffffffffffffe80);
    columnWidth_00 = (size_t *)(local_90 + (long)columnWidth_00);
  }
  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  piVar4 = SmallVectorBase<int>::operator[](in_RDI,sVar5);
  *piVar4 = iVar6;
  pbVar3 = &local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98,
             (char)((ulong)piVar4 >> 0x38),
             (allocator<char> *)CONCAT44(iVar6,in_stack_fffffffffffffe88));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__str);
  std::__cxx11::string::~string(pbVar3);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  SmallVector<char,_40UL>::~SmallVector((SmallVector<char,_40UL> *)0x6685f8);
  return;
}

Assistant:

SourceSnippet(std::string_view sourceLine, uint32_t tabStop) {
        SLANG_ASSERT(!sourceLine.empty());

        byteToColumn.resize(sourceLine.size() + 1);
        for (size_t i = 0; i < byteToColumn.size(); i++)
            byteToColumn[i] = -1;

        snippetLine.reserve(sourceLine.size());

        SmallVector<char> buffer;
        size_t column = 0;
        size_t i = 0;
        while (i < sourceLine.size()) {
            byteToColumn[i] = (int)column;

            size_t columnWidth;
            buffer.clear();
            if (!printableTextForNextChar(sourceLine, i, tabStop, buffer, columnWidth))
                invalidRanges.push_back({snippetLine.size(), buffer.size()});

            snippetLine.append(buffer.data(), buffer.size());
            column += columnWidth;
        }

        byteToColumn[sourceLine.size()] = (int)column;
        highlightLine = std::string(column, ' ');
    }